

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O2

LineReader * __thiscall Assimp::DXF::LineReader::operator++(LineReader *this)

{
  string *psVar1;
  StreamReaderLE *pSVar2;
  int iVar3;
  char *pcVar4;
  Logger *this_00;
  char *local_1b8 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  
  if (this->end == 1) {
    iVar3 = 2;
  }
  else {
    if (this->end != 0) {
      return this;
    }
    iVar3 = strtol10((this->splitter).mCur._M_dataplus._M_p,(char **)0x0);
    this->groupcode = iVar3;
    LineSplitter::operator++(&this->splitter);
    psVar1 = &(this->splitter).mCur;
    std::__cxx11::string::string((string *)&local_198,(string *)psVar1);
    std::__cxx11::string::operator=((string *)&this->value,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    LineSplitter::operator++(&this->splitter);
    if (((this->value)._M_string_length != 0) && (*(this->value)._M_dataplus._M_p == '{')) {
      while (((this->splitter).mCur._M_string_length != 0 &&
             (pcVar4 = (char *)std::__cxx11::string::at((ulong)psVar1), *pcVar4 != '}'))) {
        LineSplitter::operator++(&this->splitter);
      }
      LineSplitter::operator++(&this->splitter);
      this_00 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[34]>(&local_198,(char (*) [34])"DXF: skipped over control group (");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
      std::operator<<((ostream *)&local_198," lines)");
      std::__cxx11::stringbuf::str();
      Logger::debug(this_00,local_1b8[0]);
      std::__cxx11::string::~string((string *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    }
    pSVar2 = (this->splitter).mStream;
    if (*(int *)&pSVar2->end != *(int *)&pSVar2->current) {
      return this;
    }
    iVar3 = 1;
  }
  this->end = iVar3;
  return this;
}

Assistant:

LineReader& operator++() {
        if (end) {
            if (end == 1) {
                ++end;
            }
            return *this;
        }

        try {
            groupcode = strtol10(splitter->c_str());
            splitter++;

            value = *splitter;
            splitter++;

            // automatically skip over {} meta blocks (these are for application use
            // and currently not relevant for Assimp).
            if (value.length() && value[0] == '{') {

                size_t cnt = 0;
                for(;splitter->length() && splitter->at(0) != '}'; splitter++, cnt++);

                splitter++;
                ASSIMP_LOG_DEBUG((Formatter::format("DXF: skipped over control group ("),cnt," lines)"));
            }
        } catch(std::logic_error&) {
            ai_assert(!splitter);
        }
        if (!splitter) {
            end = 1;
        }
        return *this;
    }